

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void * region_reserve_slow(region *region,size_t size)

{
  size_t *psVar1;
  slab *psVar2;
  rlist **pprVar3;
  
  psVar2 = slab_get(region->cache,size + 8);
  if (psVar2 == (slab *)0x0) {
    pprVar3 = (rlist **)0x0;
  }
  else {
    *(undefined4 *)&psVar2[1].next_in_cache.prev = 0;
    (psVar2->next_in_list).prev = &(region->slabs).slabs;
    (psVar2->next_in_list).next = (region->slabs).slabs.next;
    (region->slabs).slabs.next = &psVar2->next_in_list;
    ((psVar2->next_in_list).next)->prev = &psVar2->next_in_list;
    psVar1 = &(region->slabs).stats.total;
    *psVar1 = *psVar1 + psVar2->size;
    pprVar3 = &psVar2[1].next_in_cache.next;
  }
  return pprVar3;
}

Assistant:

void *
region_reserve_slow(struct region *region, size_t size)
{
	/* The new slab must have at least this many bytes available. */
	size_t slab_min_size = size + rslab_sizeof() - slab_sizeof();

	struct rslab *slab;
	slab = (struct rslab *) slab_get(region->cache, slab_min_size);
	if (slab == NULL)
		return NULL;
	slab->used = 0;
	/*
	 * Sic: add the new slab to the beginning of the
	 * region, even if it is full, otherwise,
	 * region_truncate() won't work.
	 */
	slab_list_add(&region->slabs, &slab->slab, next_in_list);
	VALGRIND_MALLOCLIKE_BLOCK(rslab_data(slab), rslab_unused(slab), 0, 0);
	return rslab_data(slab);
}